

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::addExport
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,Name value,
          Name name,ExternalKind kind)

{
  Module *this_00;
  variant<wasm::Name,_wasm::HeapType> value_00;
  Name name_00;
  Export *pEVar1;
  ulong pos_00;
  Ok local_d1;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  size_t local_b8;
  char *pcStack_b0;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_a0 [3];
  allocator<char> local_81;
  string local_80;
  Err local_60;
  size_t local_40;
  char *local_38;
  ExternalKind local_30;
  uint local_2c;
  ExternalKind kind_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  Name value_local;
  
  value_local.super_IString.str._M_len = value.super_IString.str._M_str;
  this_local = value.super_IString.str._M_len;
  local_40 = name.super_IString.str._M_len;
  local_38 = name.super_IString.str._M_str;
  local_30 = kind;
  local_2c = pos;
  _kind_local = this;
  value_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  pEVar1 = Module::getExportOrNull(this->wasm,name);
  if (pEVar1 == (Export *)0x0) {
    this_00 = this->wasm;
    local_b8 = name.super_IString.str._M_len;
    pcStack_b0 = name.super_IString.str._M_str;
    std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
              ((variant<wasm::Name,wasm::HeapType> *)&local_d0,(Name *)&this_local);
    name_00.super_IString.str._M_str = pcStack_b0;
    name_00.super_IString.str._M_len = local_b8;
    value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
    str._M_str = (char *)uStack_c8;
    value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
    str._M_len = local_d0;
    value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_c0;
    Builder::makeExport((Builder *)local_a0,name_00,value_00,local_30);
    Module::addExport(this_00,local_a0);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(local_a0);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d1);
  }
  else {
    pos_00 = (ulong)local_2c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"duplicate export",&local_81);
    Lexer::err(&local_60,&this->in,pos_00,&local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_60);
    wasm::Err::~Err(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> addExport(Index pos, Name value, Name name, ExternalKind kind) {
    if (wasm.getExportOrNull(name)) {
      return in.err(pos, "duplicate export");
    }
    wasm.addExport(builder.makeExport(name, value, kind));
    return Ok{};
  }